

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  long *plVar1;
  int iVar2;
  ulong uVar3;
  undefined8 *puVar4;
  thread *ptVar5;
  undefined8 uVar6;
  ulong uVar7;
  long lVar8;
  char _C;
  string main_folder;
  string key;
  string fpath;
  string f;
  ofstream ofile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  string local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  undefined1 *local_278;
  undefined1 *local_270;
  undefined8 local_268;
  undefined1 local_260;
  undefined7 uStack_25f;
  string local_250;
  undefined1 local_230 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220 [14];
  ios_base local_138 [264];
  
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  local_298._M_string_length = 0;
  local_298.field_2._M_local_buf[0] = '\0';
  if (1 < argc) {
    __s = argv[1];
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&local_298,0,(char *)0x0,(ulong)__s);
LAB_0010331f:
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    local_2b8._M_string_length = 0;
    local_2b8.field_2._M_local_buf[0] = '\0';
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[Input] Enter key(max 16 symbols): ",0x23);
    std::operator>>((istream *)&std::cin,(string *)&local_2b8);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
    local_270 = &local_260;
    local_268 = 0;
    local_260 = 0;
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    local_2d8._M_string_length = 0;
    local_2d8.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string((string *)local_230,*argv,(allocator *)&local_2f8);
    getFileName(&local_250,(string *)local_230,&local_2d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._0_8_ != local_220) {
      operator_delete((void *)local_230._0_8_,local_220[0]._M_allocated_capacity + 1);
    }
    local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2f8,local_2d8._M_dataplus._M_p,
               local_2d8._M_dataplus._M_p + local_2d8._M_string_length);
    std::__cxx11::string::append((char *)&local_2f8);
    std::ofstream::ofstream(local_230,(string *)&local_2f8,_S_out|_S_app);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[Output] Logging into: ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"encoder.log",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
    if (argc < 2) {
      puVar4 = (undefined8 *)operator_new__(8);
      ptVar5 = (thread *)operator_new(8);
      local_2f8._M_dataplus._M_p = local_230;
      std::thread::
      thread<bool(&)(std::__cxx11::string,std::__cxx11::string,std::ofstream*),std::__cxx11::string&,std::__cxx11::string&,std::ofstream*,void>
                (ptVar5,encodeFile,&local_298,&local_2b8,
                 (basic_ofstream<char,_std::char_traits<char>_> **)&local_2f8);
      *puVar4 = ptVar5;
      std::thread::join();
    }
    else {
      uVar3 = (ulong)(argc - 1);
      puVar4 = (undefined8 *)operator_new__(uVar3 * 8);
      uVar7 = 0;
      do {
        std::__cxx11::string::string((string *)&local_2f8,argv[uVar7 + 1],(allocator *)&local_278);
        ptVar5 = (thread *)operator_new(8);
        local_278 = local_230;
        std::thread::
        thread<bool(&)(std::__cxx11::string,std::__cxx11::string,std::ofstream*),std::__cxx11::string&,std::__cxx11::string&,std::ofstream*,void>
                  (ptVar5,encodeFile,&local_2f8,&local_2b8,
                   (basic_ofstream<char,_std::char_traits<char>_> **)&local_278);
        puVar4[uVar7] = ptVar5;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
          operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
        }
        uVar7 = uVar7 + 1;
      } while (uVar3 != uVar7);
      uVar7 = 0;
      do {
        std::thread::join();
        uVar7 = uVar7 + 1;
      } while (uVar3 != uVar7);
    }
    if (argc + -1 != 0) {
      lVar8 = 0;
      do {
        plVar1 = (long *)puVar4[lVar8];
        if ((plVar1 != (long *)0x0) && (*plVar1 != 0)) {
          std::terminate();
        }
        operator_delete(plVar1,8);
        lVar8 = lVar8 + 1;
      } while (argc + -1 != lVar8);
    }
    operator_delete__(puVar4);
    std::ofstream::close();
    std::operator>>((istream *)&std::cin,(char *)&local_2f8);
    local_230._0_8_ = _VTT;
    *(undefined8 *)(local_230 + *(long *)(_VTT + -0x18)) = __filebuf;
    std::filebuf::~filebuf((filebuf *)(local_230 + 8));
    std::ios_base::~ios_base(local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,
                      CONCAT71(local_2d8.field_2._M_allocated_capacity._1_7_,
                               local_2d8.field_2._M_local_buf[0]) + 1);
    }
    if (local_270 != &local_260) {
      operator_delete(local_270,CONCAT71(uStack_25f,local_260) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,
                      CONCAT71(local_2b8.field_2._M_allocated_capacity._1_7_,
                               local_2b8.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,
                      CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                               local_298.field_2._M_local_buf[0]) + 1);
    }
    return 0;
  }
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&mu);
  if (iVar2 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[Output] You can open file(s) with this program",0x2f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
    pthread_mutex_unlock((pthread_mutex_t *)&mu);
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)&mu);
    if (iVar2 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"[Output] Or drag\'n\'drop on it",0x1d);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
      std::ostream::put('H');
      std::ostream::flush();
      pthread_mutex_unlock((pthread_mutex_t *)&mu);
      iVar2 = pthread_mutex_lock((pthread_mutex_t *)&mu);
      if (iVar2 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"[Input] Enter filename(without spaces): ",0x28);
        pthread_mutex_unlock((pthread_mutex_t *)&mu);
        std::operator>>((istream *)&std::cin,(string *)&local_298);
        goto LAB_0010331f;
      }
    }
  }
  uVar6 = std::__throw_system_error(iVar2);
  operator_delete(argv,8);
  std::ofstream::~ofstream(local_230);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,
                    CONCAT71(local_2d8.field_2._M_allocated_capacity._1_7_,
                             local_2d8.field_2._M_local_buf[0]) + 1);
  }
  if (local_270 != &local_260) {
    operator_delete(local_270,CONCAT71(uStack_25f,local_260) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,
                    CONCAT71(local_2b8.field_2._M_allocated_capacity._1_7_,
                             local_2b8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,
                    CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                             local_298.field_2._M_local_buf[0]) + 1);
  }
  _Unwind_Resume(uVar6);
}

Assistant:

int main(const int argc, const char* argv[]) {
    //path
    std::string fpath;
    if (argc>1) {
        fpath.assign(argv[1]);
    } else {
        mu.lock(); std::cout << "[Output] You can open file(s) with this program" << std::endl; mu.unlock();
        mu.lock(); std::cout << "[Output] Or drag'n'drop on it" << std::endl; mu.unlock();
        mu.lock(); std::cout << "[Input] Enter filename(without spaces): "; mu.unlock();
        std::cin >> fpath;
    }

    //key reader
    std::string key;
    std::cout << "[Input] Enter key(max 16 symbols): ";
    std::cin >> key;
    std::cout << std::endl;

    std::string f, main_folder;
    getFileName(argv[0], &main_folder);
    std::ofstream ofile(main_folder+LOG_FILENAME, std::ios::out | std::ios::app);
    std::cout << "[Output] Logging into: " << LOG_FILENAME << std::endl;

    std::thread** threads;
    if (argc>1) {
        threads = new std::thread*[argc-1];
        for (int i=0; i<argc-1; i++) {
            std::string tfpath(argv[i+1]);
            std::thread* t  = new std::thread(encodeFile, tfpath, key, &ofile);
            threads[i] = t;
        }
        for (int i=0; i<argc-1; i++) {
            threads[i]->join();
        }
    } else {
        threads = new std::thread*[1];
        std::thread* t = new std::thread(encodeFile, fpath, key, &ofile);
        threads[0] = t;
        t->join();
    }

    for (size_t i=0; i<argc-1; i++) {
        delete threads[i];
    }
    delete[] threads;

    ofile.close();
    char _C; std::cin >> _C;            //breakpoint
    return 0;
}